

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O3

void Amap_ManMap(Amap_Man_t *p)

{
  Amap_Par_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  int iVar4;
  
  Amap_ManMerge(p);
  pAVar1 = p->pPars;
  if (0 < pAVar1->nIterFlow) {
    iVar4 = 0;
    do {
      Amap_ManMatch(p,1,(uint)(iVar4 != 0));
      iVar4 = iVar4 + 1;
      pAVar1 = p->pPars;
    } while (iVar4 < pAVar1->nIterFlow);
  }
  if (0 < pAVar1->nIterArea) {
    iVar4 = 0;
    do {
      Amap_ManMatch(p,0,(uint)(iVar4 != 0 || 0 < pAVar1->nIterFlow));
      iVar4 = iVar4 + 1;
      pAVar1 = p->pPars;
    } while (iVar4 < pAVar1->nIterArea);
  }
  pVVar2 = p->vObjs;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      if (pVVar2->pArray[lVar3] != (void *)0x0) {
        *(undefined8 *)((long)pVVar2->pArray[lVar3] + 0x20) = 0;
        pVVar2 = p->vObjs;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Amap_ManMap( Amap_Man_t * p )
{
    int i;
    Amap_ManMerge( p );
    for ( i = 0; i < p->pPars->nIterFlow; i++ )
        Amap_ManMatch( p, 1, i>0 );
    for ( i = 0; i < p->pPars->nIterArea; i++ )
        Amap_ManMatch( p, 0, p->pPars->nIterFlow>0||i>0 );
/*
    for ( i = 0; i < p->pPars->nIterFlow; i++ )
        Amap_ManMatch( p, 1, 1 );
    for ( i = 0; i < p->pPars->nIterArea; i++ )
        Amap_ManMatch( p, 0, 1 );
*/
    Amap_ManCleanData( p );
}